

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_MappedFile.cpp
# Opt level: O1

void * __thiscall
axl::io::MappedViewMgr::view
          (MappedViewMgr *this,uint64_t begin,uint64_t end,uint64_t origBegin,uint64_t origEnd)

{
  size_t *psVar1;
  ViewEntry *pVVar2;
  Entry *pEVar3;
  ViewEntry *oldViewEntry;
  ViewEntry *pVVar4;
  int *piVar5;
  void *pvVar6;
  MappedViewMgr *pMVar7;
  IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
  it;
  ListLink *link;
  
  pVVar4 = (ViewEntry *)operator_new(0x38);
  (pVVar4->m_view).m_p = (void *)0x0;
  (pVVar4->m_view).m_size = 0;
  (pVVar4->m_mapIt).
  super_IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
  .
  super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
  .m_p = (Entry *)0x0;
  piVar5 = (int *)((long)this - this->m_parentOffset);
  pvVar6 = psx::Mapping::map(&pVVar4->m_view,(void *)0x0,end - begin,
                             (uint)((*(byte *)(piVar5 + 0x2a) & 1) == 0) * 2 + 1,1,*piVar5,begin);
  if (pvVar6 == (void *)0x0) {
    psx::Mapping::~Mapping(&pVVar4->m_view);
    operator_delete(pVVar4);
    pvVar6 = (void *)0x0;
  }
  else {
    pVVar4->m_begin = begin;
    pVVar4->m_end = end;
    pMVar7 = (MappedViewMgr *)
             (this->m_viewList).
             super_OwningListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::MappedViewMgr::ViewEntry>_>
             .
             super_ListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>_>
             .super_ListData<axl::io::MappedViewMgr::ViewEntry>.m_head;
    (pVVar4->super_ListLink).m_prev = (ListLink *)0x0;
    (pVVar4->super_ListLink).m_next = (ListLink *)pMVar7;
    if (pMVar7 == (MappedViewMgr *)0x0) {
      pMVar7 = this;
    }
    (pMVar7->m_viewList).
    super_OwningListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::MappedViewMgr::ViewEntry>_>
    .
    super_ListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>_>
    .super_ListData<axl::io::MappedViewMgr::ViewEntry>.m_tail = pVVar4;
    (this->m_viewList).
    super_OwningListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::MappedViewMgr::ViewEntry>_>
    .
    super_ListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>_>
    .super_ListData<axl::io::MappedViewMgr::ViewEntry>.m_head = pVVar4;
    psVar1 = &(this->m_viewList).
              super_OwningListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::MappedViewMgr::ViewEntry>_>
              .
              super_ListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>_>
              .super_ListData<axl::io::MappedViewMgr::ViewEntry>.m_count;
    *psVar1 = *psVar1 + 1;
    it.m_p = (Entry *)sl::
                      BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
                      ::visit(&(this->m_viewMap).
                               super_BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
                              ,begin);
    pVVar2 = ((it.m_p)->
             super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
             ).super_MapEntry<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>.m_value;
    if (pVVar2 != (ViewEntry *)0x0) {
      (pVVar2->m_mapIt).
      super_IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
      .
      super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
      .m_p = (Entry *)0x0;
    }
    (pVVar4->m_mapIt).
    super_IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
    .
    super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
    .m_p = it.m_p;
    ((it.m_p)->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
    ).super_MapEntry<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>.m_value = pVVar4;
    if ((IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
         )it.m_p !=
        (IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
         )0x0) {
      it.m_p = (Entry *)((it.m_p)->
                        super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
                        ).super_MapEntry<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>.
                        super_ListLink.m_next;
    }
    while (((IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
             )it.m_p !=
            (IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
             )0x0 && (pVVar4 = ((it.m_p)->
                               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
                               ).super_MapEntry<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>.
                               m_value, pVVar4->m_end <= end))) {
      pEVar3 = (Entry *)((it.m_p)->
                        super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
                        ).super_MapEntry<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>.
                        super_ListLink.m_next;
      sl::
      BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
      ::erase(&(this->m_viewMap).
               super_BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
              ,(Iterator)it.m_p);
      (pVVar4->m_mapIt).
      super_IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
      .
      super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
      .m_p = (Entry *)0x0;
      it.m_p = pEVar3;
    }
  }
  return pvVar6;
}

Assistant:

void*
MappedViewMgr::view(
	uint64_t begin,
	uint64_t end,
	uint64_t origBegin,
	uint64_t origEnd
) {
	ViewEntry* viewEntry = new ViewEntry;

	MappedFile* mappedFile = getMappedFile();
	void* p;
	size_t size = (size_t)(end - begin);

#if (_AXL_OS_WIN)
	uint_t access = (mappedFile->m_fileFlags & FileFlag_ReadOnly) ?
		FILE_MAP_READ :
		FILE_MAP_READ | FILE_MAP_WRITE;

	p = viewEntry->m_view.view(mappedFile->m_mapping, access, begin, size);
#elif (_AXL_OS_POSIX)
	int protection = (mappedFile->m_fileFlags & FileFlag_ReadOnly) ?
		PROT_READ :
		PROT_READ | PROT_WRITE;

	p = viewEntry->m_view.map(
			NULL,
			size,
			protection,
			MAP_SHARED,
			mappedFile->m_file.m_file,
			begin
		);
#endif

	if (!p) {
		delete viewEntry;
		return NULL;
	}

	viewEntry->m_begin = begin;
	viewEntry->m_end = end;

	m_viewList.insertHead(viewEntry);

	// update viewmap

	ViewMap::Iterator it = m_viewMap.visit(begin);
	if (it->m_value) {
		ViewEntry* oldViewEntry = it->m_value;

		ASSERT(oldViewEntry->m_mapIt == it);
		ASSERT(oldViewEntry->m_end < end); // otherwise, we should have just used this view!

		oldViewEntry->m_mapIt = NULL; // this view is removed from the map
	}

	viewEntry->m_mapIt = it;
	it->m_value = viewEntry;

	// now, for all the old views that are completely overlapped by this new view --
	// remove them from the map (but do not unmap yet, so recent View () results still valid)

	it++;
	while (it) {
		ViewEntry* oldViewEntry = it->m_value;
		if (oldViewEntry->m_end > end) // nope, not overlapped
			break;

		ASSERT(oldViewEntry->m_mapIt == it);

		// this view is completely overlapped and is not needed for new view requests
		// remove it from map but do not delete it to make sure last N view request are still valid

		ViewMap::Iterator next = it.getInc(1);
		m_viewMap.erase(it);
		oldViewEntry->m_mapIt = NULL;

		it = next;
	}

	return p;
}